

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

lua_Integer luaV_mod(lua_State *L,lua_Integer m,lua_Integer n)

{
  ulong uVar1;
  
  if (n + 1U < 2) {
    if (n == 0) {
      luaG_runerror(L,"attempt to perform \'n%%0\'");
    }
  }
  else {
    uVar1 = m % n;
    if (uVar1 != 0) {
      return ((long)(uVar1 ^ n) >> 0x3f & n) + uVar1;
    }
  }
  return 0;
}

Assistant:

lua_Integer luaV_mod (lua_State *L, lua_Integer m, lua_Integer n) {
  if (l_unlikely(l_castS2U(n) + 1u <= 1u)) {  /* special cases: -1 or 0 */
    if (n == 0)
      luaG_runerror(L, "attempt to perform 'n%%0'");
    return 0;   /* m % -1 == 0; avoid overflow with 0x80000...%-1 */
  }
  else {
    lua_Integer r = m % n;
    if (r != 0 && (r ^ n) < 0)  /* 'm/n' would be non-integer negative? */
      r += n;  /* correct result for different rounding */
    return r;
  }
}